

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write_segment<winmd::reader::TypeSig>
          (writer_base<cppwinrt::writer> *this,string_view *value,TypeSig *first)

{
  size_type sVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_type local_28;
  size_type offset;
  TypeSig *first_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  
  offset = (size_type)first;
  first_local = (TypeSig *)value;
  value_local = (string_view *)this;
  local_28 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0);
  if (local_28 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeSig, Rest = <>]"
                 );
  }
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,0,local_28);
  write(this,(int)&local_38,local_38._M_str,in_RCX);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                     ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_28);
  sVar1 = local_28;
  if (*pvVar2 == '^') {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)first_local);
    __n = sVar3 - 1;
    if (sVar1 == __n) {
      __assert_fail("offset != value.size() - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x12a,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeSig, Rest = <>]"
                   );
    }
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_28 + 1
                       );
    write(this,(int)*pvVar2,__buf,__n);
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)first_local,
                          local_28 + 2,0xffffffffffffffff);
    write_segment<winmd::reader::TypeSig>(this,&local_48,(TypeSig *)offset);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_28);
    if (*pvVar2 != '%') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x13d,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeSig, Rest = <>]"
                   );
    }
    cppwinrt::writer::write((writer *)this,(int)offset,__buf_00,in_RCX);
    local_58 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)first_local,
                          local_28 + 1,0xffffffffffffffff);
    write_segment(this,&local_58);
  }
  return;
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }